

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall FStat::~FStat(FStat *this)

{
  FStat *pFVar1;
  FStat **ppFVar2;
  
  this->_vptr_FStat = (_func_int **)&PTR__FStat_007cd420;
  ppFVar2 = &FirstStat;
  while ((pFVar1 = *ppFVar2, pFVar1 != (FStat *)0x0 && (pFVar1 != this))) {
    ppFVar2 = &pFVar1->m_Next->m_Next;
  }
  if (pFVar1 != this) {
    return;
  }
  *ppFVar2 = this->m_Next;
  return;
}

Assistant:

FStat::~FStat ()
{
	FStat **prev = &FirstStat;

	while (*prev && *prev != this)
		prev = &((*prev)->m_Next)->m_Next;

	if (*prev == this)
		*prev = m_Next;
}